

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lifo.h
# Opt level: O0

void __thiscall
density::detail::LifoArrayImpl<density_tests::TestObject<1UL,_1UL>,_false>::LifoArrayImpl
          (LifoArrayImpl<density_tests::TestObject<1UL,_1UL>,_false> *this,size_t i_element_count)

{
  size_t i_size;
  TestObject<1UL,_1UL> *pTVar1;
  size_t i_element_count_local;
  LifoArrayImpl<density_tests::TestObject<1UL,_1UL>,_false> *this_local;
  
  i_size = compute_mem_size(i_element_count);
  pTVar1 = (TestObject<1UL,_1UL> *)ThreadLifoAllocator<0>::allocate(i_size);
  this->m_elements = pTVar1;
  this->m_size = i_element_count;
  return;
}

Assistant:

LifoArrayImpl(size_t i_element_count)
                : m_elements(static_cast<TYPE *>(
                    detail::ThreadLifoAllocator<>::allocate(compute_mem_size(i_element_count)))),
                  m_size(i_element_count)
            {
            }